

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  int iVar3;
  WireType WVar4;
  pair<unsigned_int,_bool> pVar5;
  string *psVar6;
  char *pcVar7;
  UninterpretedOption *value_00;
  FileOptions *containing_type;
  UnknownFieldSet *pUVar8;
  bool local_8a;
  bool local_89;
  FileOptions_OptimizeMode local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  FileOptions *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x10000a5c = input;
LAB_0052a00b:
  _first_byte_or_zero = stack0xffffffffffffff98;
  kMax1ByteVarint = 0x3fff;
  tag_2 = 0;
  if (stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) {
    tag_2 = (uint32)*stack0xffffffffffffff98->buffer_;
    if ((char)*stack0xffffffffffffff98->buffer_ < '\x01') {
      if ((stack0xffffffffffffff98->buffer_end_ <= stack0xffffffffffffff98->buffer_ + 1) ||
         ((*stack0xffffffffffffff98->buffer_ & (stack0xffffffffffffff98->buffer_[1] ^ 0xff)) < 0x80)
         ) goto LAB_0052a18a;
      uStack_30 = 0x3fff;
      tag_1 = (uint)stack0xffffffffffffff98->buffer_[1] * 0x80 +
              (*stack0xffffffffffffff98->buffer_ - 0x80);
      io::CodedInputStream::Advance(stack0xffffffffffffff98,2);
      local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
      local_35 = local_8a;
      pVar5 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    else {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar5 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
  }
  else {
LAB_0052a18a:
    local_3c = io::CodedInputStream::ReadTagFallback(stack0xffffffffffffff98,tag_2);
    local_3d = local_3c - 1 < kMax1ByteVarint;
    pVar5 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
    local_10 = pVar5.first;
    uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
  }
  value._0_1_ = (undefined1)uStack_c;
  local_74 = local_10;
  p.first = local_74;
  if ((uStack_c & 1) != 0) {
    iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_10);
    pCVar1 = stack0xffffffffffffff98;
    if (iVar3 == 1) {
      if ((p.first & 0xff) != 10) goto LAB_0052a992;
      psVar6 = mutable_java_package_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
      if (!bVar2) {
        return false;
      }
      java_package_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      java_package_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar7,iVar3,PARSE,"google.protobuf.FileOptions.java_package");
      goto LAB_0052a00b;
    }
    if (iVar3 == 8) {
      if ((p.first & 0xff) != 0x42) goto LAB_0052a992;
      psVar6 = mutable_java_outer_classname_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
      if (!bVar2) {
        return false;
      }
      java_outer_classname_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      java_outer_classname_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar7,iVar3,PARSE,"google.protobuf.FileOptions.java_outer_classname");
      goto LAB_0052a00b;
    }
    if (iVar3 == 9) {
      if ((p.first & 0xff) != 0x48) goto LAB_0052a992;
      bVar2 = internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,(int *)&local_78);
      if (!bVar2) {
        return false;
      }
      bVar2 = FileOptions_OptimizeMode_IsValid(local_78);
      if (bVar2) {
        set_optimize_for(this,local_78);
      }
      else {
        pUVar8 = mutable_unknown_fields(this);
        UnknownFieldSet::AddVarint(pUVar8,9,(long)(int)local_78);
      }
      goto LAB_0052a00b;
    }
    if (iVar3 == 10) {
      if ((p.first & 0xff) == 0x50) {
        set_has_java_multiple_files(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->java_multiple_files_);
        goto joined_r0x0052a4c4;
      }
      goto LAB_0052a992;
    }
    if (iVar3 == 0xb) {
      if ((p.first & 0xff) != 0x5a) goto LAB_0052a992;
      psVar6 = mutable_go_package_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
      if (!bVar2) {
        return false;
      }
      go_package_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      go_package_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8StringNamedField
                (pcVar7,iVar3,PARSE,"google.protobuf.FileOptions.go_package");
      goto LAB_0052a00b;
    }
    if (iVar3 == 0x10) {
      if ((p.first & 0xff) != 0x80) goto LAB_0052a992;
      set_has_cc_generic_services(this);
      bVar2 = internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (stack0xffffffffffffff98,&this->cc_generic_services_);
      goto joined_r0x0052a4c4;
    }
    if (iVar3 == 0x11) {
      if ((p.first & 0xff) == 0x88) {
        set_has_java_generic_services(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->java_generic_services_);
        goto joined_r0x0052a4c4;
      }
    }
    else if (iVar3 == 0x12) {
      if ((p.first & 0xff) == 0x90) {
        set_has_py_generic_services(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->py_generic_services_);
        goto joined_r0x0052a4c4;
      }
    }
    else if (iVar3 == 0x14) {
      if ((p.first & 0xff) == 0xa0) {
        set_has_java_generate_equals_and_hash(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->java_generate_equals_and_hash_);
        goto joined_r0x0052a4c4;
      }
    }
    else if (iVar3 == 0x17) {
      if ((p.first & 0xff) == 0xb8) {
        set_has_deprecated(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->deprecated_);
        goto joined_r0x0052a4c4;
      }
    }
    else if (iVar3 == 0x1b) {
      if ((p.first & 0xff) == 0xd8) {
        set_has_java_string_check_utf8(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->java_string_check_utf8_);
        goto joined_r0x0052a4c4;
      }
    }
    else if (iVar3 == 0x1f) {
      if ((p.first & 0xff) == 0xf8) {
        set_has_cc_enable_arenas(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->cc_enable_arenas_);
        goto joined_r0x0052a4c4;
      }
    }
    else if (iVar3 == 0x24) {
      if ((p.first & 0xff) == 0x22) {
        psVar6 = mutable_objc_class_prefix_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        objc_class_prefix_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        objc_class_prefix_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FileOptions.objc_class_prefix");
        goto LAB_0052a00b;
      }
    }
    else if (iVar3 == 0x25) {
      if ((p.first & 0xff) == 0x2a) {
        psVar6 = mutable_csharp_namespace_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        csharp_namespace_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        csharp_namespace_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FileOptions.csharp_namespace");
        goto LAB_0052a00b;
      }
    }
    else if (iVar3 == 0x27) {
      if ((p.first & 0xff) == 0x3a) {
        psVar6 = mutable_swift_prefix_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        swift_prefix_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        swift_prefix_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FileOptions.swift_prefix");
        goto LAB_0052a00b;
      }
    }
    else {
      if (iVar3 == 0x28) {
        if ((p.first & 0xff) != 0x42) goto LAB_0052a992;
        psVar6 = mutable_php_class_prefix_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        php_class_prefix_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        php_class_prefix_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FileOptions.php_class_prefix");
        goto LAB_0052a00b;
      }
      if ((iVar3 == 999) && ((p.first & 0xff) == 0x3a)) {
        value_00 = add_uninterpreted_option(this);
        bVar2 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::UninterpretedOption>(pCVar1,value_00);
        goto joined_r0x0052a4c4;
      }
    }
  }
LAB_0052a992:
  if ((p.first == 0) ||
     (WVar4 = internal::WireFormatLite::GetTagWireType(p.first), pCVar1 = stack0xffffffffffffff98,
     tag_00 = p.first, WVar4 == WIRETYPE_END_GROUP)) {
    return true;
  }
  if (p.first < 8000) {
    pUVar8 = mutable_unknown_fields(this);
    bVar2 = internal::WireFormat::SkipField(pCVar1,tag_00,pUVar8);
  }
  else {
    containing_type = internal_default_instance();
    pUVar8 = mutable_unknown_fields(this);
    bVar2 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,tag_00,pCVar1,&containing_type->super_Message,pUVar8);
  }
joined_r0x0052a4c4:
  if (!bVar2) {
    return false;
  }
  goto LAB_0052a00b;
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_outer_classname");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_java_multiple_files();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.go_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(128u)) {
          set_has_cc_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(136u)) {
          set_has_java_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(144u)) {
          set_has_py_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {
          set_has_java_generate_equals_and_hash();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 23 [default = false];
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(184u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(216u)) {
          set_has_java_string_check_utf8();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_string_check_utf8_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_enable_arenas = 31 [default = false];
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(248u)) {
          set_has_cc_enable_arenas();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_enable_arenas_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string objc_class_prefix = 36;
      case 36: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(290u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_objc_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->objc_class_prefix().data(), this->objc_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.objc_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string csharp_namespace = 37;
      case 37: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(298u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_csharp_namespace()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->csharp_namespace().data(), this->csharp_namespace().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.csharp_namespace");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string swift_prefix = 39;
      case 39: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(314u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_swift_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->swift_prefix().data(), this->swift_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.swift_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string php_class_prefix = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_php_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->php_class_prefix().data(), this->php_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.php_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileOptions)
  return false;
#undef DO_
}